

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_recv_cack(udp_ep *ep,udp_sp_creq *cack,nng_sockaddr *sa)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint16_t uVar6;
  int iVar7;
  udp_pipe *p;
  nni_time nVar8;
  nng_duration nVar9;
  udp_disc_reason reason;
  udp_sp_msg local_44;
  
  uVar4 = cack->us_sender_id;
  p = (udp_pipe *)nni_id_get(&ep->pipes,(ulong)cack->us_peer_id);
  if (((p == (udp_pipe *)0x0) || (p->closed != false)) ||
     ((uVar5 = p->peer_id, uVar5 != 0 && (uVar5 != uVar4)))) {
    local_44._0_2_ = 0x301;
    local_44.data.us_type = ep->proto;
    uVar1 = cack->us_sender_id;
    uVar2 = cack->us_peer_id;
    local_44._4_8_ = CONCAT44(uVar1,uVar2);
    local_44.data.us_sequence = 0;
    local_44.data.us_length = 2;
    udp_queue_tx(ep,sa,&local_44,(nni_msg *)0x0);
  }
  else {
    if (uVar5 == 0) {
      uVar6 = cack->us_type;
    }
    else {
      uVar6 = p->peer;
      if (uVar6 != cack->us_type) {
        reason = DISC_TYPE;
        goto LAB_001329ed;
      }
    }
    p->sndmax = cack->us_recv_max;
    p->peer = uVar6;
    p->peer_id = cack->us_sender_id;
    bVar3 = cack->us_refresh;
    if (bVar3 == 0) {
      reason = DISC_NEGO;
LAB_001329ed:
      udp_send_disc(ep,p,reason);
      return;
    }
    if (uVar5 == 0) {
      nVar9 = ep->refresh;
      p->refresh = nVar9;
      p->peer_seq = cack->us_sequence + 1;
    }
    else {
      nVar9 = p->refresh;
    }
    iVar7 = (uint)bVar3 * 1000;
    if (iVar7 < nVar9) {
      p->refresh = iVar7;
    }
    nVar8 = nni_clock();
    p->next_wake = nVar8 + (long)p->refresh;
    p->expire = (long)p->refresh * 5 + nVar8;
    udp_pipe_schedule(p);
    if (uVar5 == 0) {
      nni_list_append(&ep->connpipes,p);
      udp_ep_match(ep);
      return;
    }
  }
  return;
}

Assistant:

static void
udp_recv_cack(udp_ep *ep, udp_sp_creq *cack, nng_sockaddr *sa)
{
	udp_pipe *p;
	bool      first;
	nni_time  now;

	if ((p = udp_find_pipe(ep, cack->us_peer_id, cack->us_sender_id)) &&
	    (!p->closed)) {
		if ((p->peer_id != 0) && (p->peer != cack->us_type)) {
			udp_send_disc(ep, p, DISC_TYPE);
			return;
		}

		first = (p->peer_id == 0);

		// so we know who it is from.. this is a refresh.
		p->sndmax  = cack->us_recv_max;
		p->peer    = cack->us_type;
		p->peer_id = cack->us_sender_id;

		if (cack->us_refresh == 0) {
			udp_send_disc(ep, p, DISC_NEGO);
			return;
		}
		if (first) {
			p->refresh  = ep->refresh;
			p->peer_seq = cack->us_sequence + 1;
		}
		if ((cack->us_refresh * NNI_SECOND) < p->refresh) {
			p->refresh = cack->us_refresh * NNI_SECOND;
		}
		now          = nni_clock();
		p->next_wake = now + UDP_PIPE_REFRESH(p);
		p->expire    = now + UDP_PIPE_TIMEOUT(p);
		udp_pipe_schedule(p);

		if (first) {
			nni_list_append(&ep->connpipes, p);
			udp_ep_match(ep);
		}
		return;
	}

	// a CACK without a corresponding CREQ (or timed out pipe already)
	udp_send_disc_full(
	    ep, sa, cack->us_peer_id, cack->us_sender_id, 0, DISC_NOTCONN);
}